

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

bool __thiscall wasm::Literal::isZero(Literal *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  double dVar4;
  uint uVar5;
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [13];
  undefined1 auVar9 [14];
  BasicType BVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  undefined1 in_XMM1_Ba;
  undefined1 in_XMM1_Bb;
  undefined1 in_XMM1_Bc;
  undefined1 in_XMM1_Bd;
  undefined1 in_XMM1_Be;
  undefined1 in_XMM1_Bf;
  undefined1 in_XMM1_Bg;
  undefined1 in_XMM1_Bh;
  uint8_t uStack_28;
  uint8_t uStack_27;
  uint8_t uStack_26;
  uint8_t uStack_25;
  uint8_t uStack_24;
  uint8_t uStack_23;
  uint8_t uStack_22;
  uint8_t uStack_21;
  uint8_t zeros [16];
  Literal *this_local;
  
  zeros._8_8_ = this;
  BVar10 = wasm::Type::getBasic(&this->type);
  switch(BVar10) {
  case i32:
    this_local._7_1_ = (this->field_0).i32 == 0;
    break;
  case i64:
    this_local._7_1_ = (this->field_0).i64 == 0;
    break;
  case f32:
    fVar3 = bit_cast<float,int>((int *)this);
    this_local._7_1_ =
         fVar3 == (float)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                         ^ CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                         );
    break;
  case f64:
    dVar4 = bit_cast<double,long>((long *)this);
    uVar5 = CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ^
            CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)));
    this_local._7_1_ =
         dVar4 == (double)CONCAT17((char)(uVar5 >> 0x18),
                                   CONCAT16((char)(uVar5 >> 0x10),
                                            CONCAT15((char)(uVar5 >> 8),
                                                     CONCAT14((char)uVar5,
                                                              CONCAT13(in_XMM1_Bd,
                                                                       CONCAT12(in_XMM1_Bc,
                                                                                CONCAT11(in_XMM1_Bb,
                                                                                         in_XMM1_Ba)
                                                                               )) ^
                                                              CONCAT13(in_XMM1_Bd,
                                                                       CONCAT12(in_XMM1_Bc,
                                                                                CONCAT11(in_XMM1_Bb,
                                                                                         in_XMM1_Ba)
                                                                               ))))));
    break;
  case v128:
    memset(&uStack_28,0,0x10);
    cVar11 = -((this->field_0).v128[0] == uStack_28);
    cVar12 = -((this->field_0).v128[1] == uStack_27);
    cVar13 = -((this->field_0).v128[2] == uStack_26);
    cVar14 = -((this->field_0).v128[3] == uStack_25);
    cVar15 = -((this->field_0).v128[4] == uStack_24);
    cVar16 = -((this->field_0).v128[5] == uStack_23);
    cVar17 = -((this->field_0).v128[6] == uStack_22);
    cVar18 = -((this->field_0).v128[7] == uStack_21);
    cVar19 = -((this->field_0).v128[8] == zeros[0]);
    cVar20 = -((this->field_0).v128[9] == zeros[1]);
    cVar21 = -((this->field_0).v128[10] == zeros[2]);
    cVar22 = -((this->field_0).v128[0xb] == zeros[3]);
    cVar23 = -((this->field_0).v128[0xc] == zeros[4]);
    cVar24 = -((this->field_0).v128[0xd] == zeros[5]);
    cVar25 = -((this->field_0).v128[0xe] == zeros[6]);
    bVar26 = -((this->field_0).v128[0xf] == zeros[7]);
    auVar1[1] = cVar12;
    auVar1[0] = cVar11;
    auVar1[2] = cVar13;
    auVar1[3] = cVar14;
    auVar1[4] = cVar15;
    auVar1[5] = cVar16;
    auVar1[6] = cVar17;
    auVar1[7] = cVar18;
    auVar1[8] = cVar19;
    auVar1[9] = cVar20;
    auVar1[10] = cVar21;
    auVar1[0xb] = cVar22;
    auVar1[0xc] = cVar23;
    auVar1[0xd] = cVar24;
    auVar1[0xe] = cVar25;
    auVar1[0xf] = bVar26;
    auVar2[1] = cVar12;
    auVar2[0] = cVar11;
    auVar2[2] = cVar13;
    auVar2[3] = cVar14;
    auVar2[4] = cVar15;
    auVar2[5] = cVar16;
    auVar2[6] = cVar17;
    auVar2[7] = cVar18;
    auVar2[8] = cVar19;
    auVar2[9] = cVar20;
    auVar2[10] = cVar21;
    auVar2[0xb] = cVar22;
    auVar2[0xc] = cVar23;
    auVar2[0xd] = cVar24;
    auVar2[0xe] = cVar25;
    auVar2[0xf] = bVar26;
    auVar9[1] = cVar14;
    auVar9[0] = cVar13;
    auVar9[2] = cVar15;
    auVar9[3] = cVar16;
    auVar9[4] = cVar17;
    auVar9[5] = cVar18;
    auVar9[6] = cVar19;
    auVar9[7] = cVar20;
    auVar9[8] = cVar21;
    auVar9[9] = cVar22;
    auVar9[10] = cVar23;
    auVar9[0xb] = cVar24;
    auVar9[0xc] = cVar25;
    auVar9[0xd] = bVar26;
    auVar8[1] = cVar15;
    auVar8[0] = cVar14;
    auVar8[2] = cVar16;
    auVar8[3] = cVar17;
    auVar8[4] = cVar18;
    auVar8[5] = cVar19;
    auVar8[6] = cVar20;
    auVar8[7] = cVar21;
    auVar8[8] = cVar22;
    auVar8[9] = cVar23;
    auVar8[10] = cVar24;
    auVar8[0xb] = cVar25;
    auVar8[0xc] = bVar26;
    auVar7[1] = cVar16;
    auVar7[0] = cVar15;
    auVar7[2] = cVar17;
    auVar7[3] = cVar18;
    auVar7[4] = cVar19;
    auVar7[5] = cVar20;
    auVar7[6] = cVar21;
    auVar7[7] = cVar22;
    auVar7[8] = cVar23;
    auVar7[9] = cVar24;
    auVar7[10] = cVar25;
    auVar7[0xb] = bVar26;
    auVar6[1] = cVar17;
    auVar6[0] = cVar16;
    auVar6[2] = cVar18;
    auVar6[3] = cVar19;
    auVar6[4] = cVar20;
    auVar6[5] = cVar21;
    auVar6[6] = cVar22;
    auVar6[7] = cVar23;
    auVar6[8] = cVar24;
    auVar6[9] = cVar25;
    auVar6[10] = bVar26;
    this_local._7_1_ =
         (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB141(auVar9 >> 7,0) & 1) << 2 |
                  (ushort)(SUB131(auVar8 >> 7,0) & 1) << 3 |
                  (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                  (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                  (ushort)((byte)(CONCAT19(bVar26,CONCAT18(cVar25,CONCAT17(cVar24,CONCAT16(cVar23,
                                                  CONCAT15(cVar22,CONCAT14(cVar21,CONCAT13(cVar20,
                                                  CONCAT12(cVar19,CONCAT11(cVar18,cVar17))))))))) >>
                                 7) & 1) << 6 |
                  (ushort)((byte)(CONCAT18(bVar26,CONCAT17(cVar25,CONCAT16(cVar24,CONCAT15(cVar23,
                                                  CONCAT14(cVar22,CONCAT13(cVar21,CONCAT12(cVar20,
                                                  CONCAT11(cVar19,cVar18)))))))) >> 7) & 1) << 7 |
                 (ushort)(bVar26 >> 7) << 0xf) == 0xffff;
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                       ,0x7f);
  }
  return this_local._7_1_;
}

Assistant:

bool isZero() const {
    switch (type.getBasic()) {
      case Type::i32:
        return i32 == 0;
      case Type::i64:
        return i64 == 0LL;
      case Type::f32:
        return bit_cast<float>(i32) == 0.0f;
      case Type::f64:
        return bit_cast<double>(i64) == 0.0;
      case Type::v128: {
        uint8_t zeros[16] = {0};
        return memcmp(&v128, zeros, 16) == 0;
      }
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }